

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::RemoveVariablesInString(cmMakefile *this,string *source,bool atOnly)

{
  bool bVar1;
  size_type sVar2;
  undefined1 local_2a0 [8];
  RegularExpression var2;
  RegularExpression varb;
  undefined1 local_f0 [8];
  RegularExpression var;
  bool atOnly_local;
  string *source_local;
  cmMakefile *this_local;
  
  var.searchstring._7_1_ = atOnly;
  if (!atOnly) {
    cmsys::RegularExpression::RegularExpression
              ((RegularExpression *)local_f0,"(\\${[A-Za-z_0-9]*})");
    while( true ) {
      bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_f0,source);
      if (!bVar1) break;
      sVar2 = cmsys::RegularExpression::start((RegularExpression *)local_f0);
      cmsys::RegularExpression::end((RegularExpression *)local_f0);
      cmsys::RegularExpression::start((RegularExpression *)local_f0);
      std::__cxx11::string::erase((ulong)source,sVar2);
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_f0);
  }
  if ((var.searchstring._7_1_ & 1) == 0) {
    cmsys::RegularExpression::RegularExpression
              ((RegularExpression *)&var2.searchstring,"(\\$ENV{[A-Za-z_0-9]*})");
    while( true ) {
      bVar1 = cmsys::RegularExpression::find((RegularExpression *)&var2.searchstring,source);
      if (!bVar1) break;
      sVar2 = cmsys::RegularExpression::start((RegularExpression *)&var2.searchstring);
      cmsys::RegularExpression::end((RegularExpression *)&var2.searchstring);
      cmsys::RegularExpression::start((RegularExpression *)&var2.searchstring);
      std::__cxx11::string::erase((ulong)source,sVar2);
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)&var2.searchstring);
  }
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_2a0,"(@[A-Za-z_0-9]*@)");
  while( true ) {
    bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_2a0,source);
    if (!bVar1) break;
    sVar2 = cmsys::RegularExpression::start((RegularExpression *)local_2a0);
    cmsys::RegularExpression::end((RegularExpression *)local_2a0);
    cmsys::RegularExpression::start((RegularExpression *)local_2a0);
    std::__cxx11::string::erase((ulong)source,sVar2);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_2a0);
  return;
}

Assistant:

void cmMakefile::RemoveVariablesInString(std::string& source,
                                         bool atOnly) const
{
  if (!atOnly) {
    cmsys::RegularExpression var("(\\${[A-Za-z_0-9]*})");
    while (var.find(source)) {
      source.erase(var.start(), var.end() - var.start());
    }
  }

  if (!atOnly) {
    cmsys::RegularExpression varb("(\\$ENV{[A-Za-z_0-9]*})");
    while (varb.find(source)) {
      source.erase(varb.start(), varb.end() - varb.start());
    }
  }
  cmsys::RegularExpression var2("(@[A-Za-z_0-9]*@)");
  while (var2.find(source)) {
    source.erase(var2.start(), var2.end() - var2.start());
  }
}